

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QGraphicsSceneBspTree::Node> * __thiscall
QList<QGraphicsSceneBspTree::Node>::fill
          (QList<QGraphicsSceneBspTree::Node> *this,parameter_type t,qsizetype newSize)

{
  anon_union_8_2_82aba17e_for_Node_0 *paVar1;
  undefined4 uVar2;
  anon_union_8_2_82aba17e_for_Node_0 aVar3;
  Type TVar4;
  Data *pDVar5;
  QArrayData *pQVar6;
  undefined4 uVar7;
  anon_union_8_2_82aba17e_for_Node_0 aVar8;
  Node *pNVar9;
  Node *pNVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar5 = (this->d).d;
  lVar11 = newSize;
  if (pDVar5 != (Data *)0x0) {
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar5 == (Data *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = (pDVar5->super_QArrayData).alloc;
      }
      if (newSize <= lVar12) {
        aVar3 = t->field_0;
        TVar4 = t->type;
        uVar2 = *(undefined4 *)&t->field_0xc;
        lVar11 = (this->d).size;
        if (newSize <= lVar11) {
          lVar11 = newSize;
        }
        if (lVar11 != 0) {
          pNVar10 = (this->d).ptr;
          lVar12 = 0;
          do {
            aVar8 = *(anon_union_8_2_82aba17e_for_Node_0 *)&t->type;
            paVar1 = (anon_union_8_2_82aba17e_for_Node_0 *)((long)&pNVar10->field_0 + lVar12);
            *paVar1 = t->field_0;
            paVar1[1] = aVar8;
            lVar12 = lVar12 + 0x10;
          } while (lVar11 * 0x10 != lVar12);
        }
        lVar11 = (this->d).size;
        if (lVar11 < newSize) {
          if (newSize != lVar11) {
            pNVar10 = (this->d).ptr + lVar11;
            (this->d).size = newSize;
            lVar11 = lVar11 - newSize;
            do {
              pNVar10->field_0 = aVar3;
              pNVar10->type = TVar4;
              *(undefined4 *)&pNVar10->field_0xc = uVar2;
              pNVar10 = pNVar10 + 1;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0);
          }
        }
        else if (newSize < lVar11) {
          (this->d).size = newSize;
        }
        goto LAB_00630187;
      }
    }
    if (pDVar5 != (Data *)0x0) {
      lVar11 = (pDVar5->super_QArrayData).alloc;
      if (lVar11 <= newSize) {
        lVar11 = newSize;
      }
      if (((pDVar5->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar11 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pNVar9 = (Node *)QArrayData::allocate(&local_30,0x10,0x10,lVar11,KeepSize);
  pNVar10 = pNVar9;
  lVar11 = newSize;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    do {
      uVar2 = *(undefined4 *)((long)&t->field_0 + 4);
      TVar4 = t->type;
      uVar7 = *(undefined4 *)&t->field_0xc;
      (pNVar10->field_0).leafIndex = (t->field_0).leafIndex;
      *(undefined4 *)((long)&pNVar10->field_0 + 4) = uVar2;
      pNVar10->type = TVar4;
      *(undefined4 *)&pNVar10->field_0xc = uVar7;
      lVar11 = lVar11 + -1;
      pNVar10 = pNVar10 + 1;
    } while (lVar11 != 0);
  }
  pQVar6 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = pNVar9;
  (this->d).size = newSize;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,0x10,0x10);
    }
  }
LAB_00630187:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}